

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx2::OrientedDiscMiMBIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  Scene *pSVar12;
  Geometry *pGVar13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  float fVar70;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined4 uStack_374;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  RTCFilterFunctionNArguments local_310;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  uint local_260 [4];
  uint uStack_250;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar12 = context->scene;
  local_260[0] = Disc->sharedGeomID;
  pGVar13 = (pSVar12->geometries).items[local_260[0]].ptr;
  fVar3 = (pGVar13->time_range).lower;
  fVar70 = pGVar13->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar3) / ((pGVar13->time_range).upper - fVar3));
  auVar43 = vroundss_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),9);
  auVar43 = vminss_avx(auVar43,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar17 = vmaxss_avx(ZEXT816(0) << 0x20,auVar43);
  iVar33 = (int)auVar17._0_4_;
  uVar34 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar14 = *(long *)&pGVar13[2].numPrimitives;
  lVar35 = (long)iVar33 * 0x38;
  lVar15 = *(long *)(lVar14 + 0x10 + lVar35);
  lVar42 = *(long *)(lVar14 + lVar35);
  uVar38 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar40 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar41 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar37 = (ulong)(Disc->primIDs).field_0.i[4];
  puVar1 = (undefined8 *)(lVar42 + lVar15 * uVar37);
  local_360._16_8_ = *puVar1;
  local_360._0_16_ = *(undefined1 (*) [16])(lVar42 + lVar15 * uVar34);
  local_360._24_8_ = puVar1[1];
  uVar32 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar43 = *(undefined1 (*) [16])(lVar42 + lVar15 * uVar32);
  auVar71._16_16_ = auVar43;
  auVar71._0_16_ = *(undefined1 (*) [16])(lVar42 + lVar15 * uVar38);
  uVar39 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar51._16_16_ = *(undefined1 (*) [16])(lVar42 + lVar15 * uVar39);
  auVar51._0_16_ = *(undefined1 (*) [16])(lVar42 + lVar15 * uVar40);
  uVar36 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar52._16_16_ = *(undefined1 (*) [16])(lVar42 + lVar15 * uVar36);
  auVar52._0_16_ = *(undefined1 (*) [16])(lVar42 + lVar15 * uVar41);
  p_Var16 = pGVar13[2].intersectionFilterN;
  lVar15 = *(long *)(p_Var16 + lVar35);
  lVar42 = *(long *)(p_Var16 + lVar35 + 0x10);
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar42 * uVar37);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar15 + lVar42 * uVar34);
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar42 * uVar32);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar15 + lVar42 * uVar38);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar42 * uVar39);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar15 + lVar42 * uVar40);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar42 * uVar36);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar15 + lVar42 * uVar41);
  lVar42 = (long)(iVar33 + 1) * 0x38;
  lVar15 = *(long *)(lVar14 + lVar42);
  lVar14 = *(long *)(lVar14 + 0x10 + lVar42);
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar37);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar34);
  auVar80._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar32);
  auVar80._0_16_ = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar38);
  auVar82._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar39);
  auVar82._0_16_ = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar40);
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar36);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar41);
  lVar14 = *(long *)(p_Var16 + lVar42);
  lVar15 = *(long *)(p_Var16 + lVar42 + 0x10);
  pauVar2 = (undefined1 (*) [12])(lVar14 + uVar38 * lVar15);
  uStack_374 = (undefined4)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
  auVar44._16_16_ = *(undefined1 (*) [16])(lVar14 + uVar37 * lVar15);
  auVar44._0_16_ = *(undefined1 (*) [16])(lVar14 + uVar34 * lVar15);
  fVar70 = fVar70 - auVar17._0_4_;
  auVar48 = vunpcklps_avx(local_360,auVar51);
  auVar18 = vunpckhps_avx(local_360,auVar51);
  auVar51 = vunpcklps_avx(auVar71,auVar52);
  auVar52 = vunpckhps_avx(auVar71,auVar52);
  auVar20 = vunpcklps_avx(auVar48,auVar51);
  auVar45 = vunpckhps_avx(auVar48,auVar51);
  auVar71 = vunpcklps_avx(auVar56,auVar64);
  auVar48 = vunpckhps_avx(auVar56,auVar64);
  auVar21 = vunpcklps_avx(auVar59,auVar68);
  auVar51 = vunpckhps_avx(auVar59,auVar68);
  auVar60._16_16_ = *(undefined1 (*) [16])(lVar14 + uVar39 * lVar15);
  auVar60._0_16_ = *(undefined1 (*) [16])(lVar14 + uVar40 * lVar15);
  auVar22 = vunpcklps_avx(auVar48,auVar51);
  auVar53 = vunpcklps_avx(auVar71,auVar21);
  auVar48 = vunpckhps_avx(auVar71,auVar21);
  auVar51 = vunpcklps_avx(auVar79,auVar82);
  local_2a0 = vunpckhps_avx(auVar79,auVar82);
  auVar21 = vunpcklps_avx(auVar80,auVar49);
  auVar71 = vunpckhps_avx(auVar80,auVar49);
  auVar23 = vunpcklps_avx(auVar51,auVar21);
  auVar21 = vunpckhps_avx(auVar51,auVar21);
  auVar49 = vunpcklps_avx(auVar44,auVar60);
  auVar51 = vunpckhps_avx(auVar44,auVar60);
  auVar65._12_4_ = uStack_374;
  auVar65._0_12_ = *pauVar2;
  auVar65._16_16_ = *(undefined1 (*) [16])(lVar14 + uVar32 * lVar15);
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar14 + lVar15 * uVar36);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar14 + uVar41 * lVar15);
  auVar44 = vunpcklps_avx(auVar65,auVar61);
  auVar19 = vunpckhps_avx(auVar65,auVar61);
  auVar19 = vunpcklps_avx(auVar51,auVar19);
  auVar50 = vunpcklps_avx(auVar49,auVar44);
  auVar51 = vunpckhps_avx(auVar49,auVar44);
  fVar3 = 1.0 - fVar70;
  auVar66._4_4_ = fVar3;
  auVar66._0_4_ = fVar3;
  auVar66._8_4_ = fVar3;
  auVar66._12_4_ = fVar3;
  auVar66._16_4_ = fVar3;
  auVar66._20_4_ = fVar3;
  auVar66._24_4_ = fVar3;
  auVar66._28_4_ = fVar3;
  auVar62._0_4_ = fVar70 * auVar23._0_4_;
  auVar62._4_4_ = fVar70 * auVar23._4_4_;
  auVar62._8_4_ = fVar70 * auVar23._8_4_;
  auVar62._12_4_ = fVar70 * auVar23._12_4_;
  auVar62._16_4_ = fVar70 * auVar23._16_4_;
  auVar62._20_4_ = fVar70 * auVar23._20_4_;
  auVar62._24_4_ = fVar70 * auVar23._24_4_;
  auVar62._28_4_ = 0;
  auVar17 = vfmadd231ps_fma(auVar62,auVar66,auVar20);
  auVar20._4_4_ = fVar70 * auVar50._4_4_;
  auVar20._0_4_ = fVar70 * auVar50._0_4_;
  auVar20._8_4_ = fVar70 * auVar50._8_4_;
  auVar20._12_4_ = fVar70 * auVar50._12_4_;
  auVar20._16_4_ = fVar70 * auVar50._16_4_;
  auVar20._20_4_ = fVar70 * auVar50._20_4_;
  auVar20._24_4_ = fVar70 * auVar50._24_4_;
  auVar20._28_4_ = 0;
  auVar50._0_4_ = fVar70 * auVar51._0_4_;
  auVar50._4_4_ = fVar70 * auVar51._4_4_;
  auVar50._8_4_ = fVar70 * auVar51._8_4_;
  auVar50._12_4_ = fVar70 * auVar51._12_4_;
  auVar50._16_4_ = fVar70 * auVar51._16_4_;
  auVar50._20_4_ = fVar70 * auVar51._20_4_;
  auVar50._24_4_ = fVar70 * auVar51._24_4_;
  auVar50._28_4_ = 0;
  auVar23._4_4_ = fVar70 * auVar19._4_4_;
  auVar23._0_4_ = fVar70 * auVar19._0_4_;
  auVar23._8_4_ = fVar70 * auVar19._8_4_;
  auVar23._12_4_ = fVar70 * auVar19._12_4_;
  auVar23._16_4_ = fVar70 * auVar19._16_4_;
  auVar23._20_4_ = fVar70 * auVar19._20_4_;
  auVar23._24_4_ = fVar70 * auVar19._24_4_;
  auVar23._28_4_ = auVar51._28_4_;
  auVar24 = vfmadd231ps_fma(auVar20,auVar66,auVar53);
  auVar25 = vfmadd231ps_fma(auVar50,auVar66,auVar48);
  auVar26 = vfmadd231ps_fma(auVar23,auVar66,auVar22);
  bVar11 = Disc->numPrimitives;
  local_260[1] = local_260[0];
  local_260[2] = local_260[0];
  local_260[3] = local_260[0];
  uStack_250 = local_260[0];
  uStack_24c = local_260[0];
  uStack_248 = local_260[0];
  uStack_244 = local_260[0];
  fVar3 = *(float *)(ray + k * 4 + 0x80);
  local_2e0._4_4_ = fVar3;
  local_2e0._0_4_ = fVar3;
  local_2e0._8_4_ = fVar3;
  local_2e0._12_4_ = fVar3;
  local_2e0._16_4_ = fVar3;
  local_2e0._20_4_ = fVar3;
  local_2e0._24_4_ = fVar3;
  local_2e0._28_4_ = fVar3;
  fVar4 = *(float *)(ray + k * 4 + 0xa0);
  local_2c0._4_4_ = fVar4;
  local_2c0._0_4_ = fVar4;
  local_2c0._8_4_ = fVar4;
  local_2c0._12_4_ = fVar4;
  local_2c0._16_4_ = fVar4;
  local_2c0._20_4_ = fVar4;
  local_2c0._24_4_ = fVar4;
  local_2c0._28_4_ = fVar4;
  fVar5 = *(float *)(ray + k * 4 + 0xc0);
  auVar48._4_4_ = auVar26._4_4_ * fVar5;
  auVar48._0_4_ = auVar26._0_4_ * fVar5;
  auVar48._8_4_ = auVar26._8_4_ * fVar5;
  auVar48._12_4_ = auVar26._12_4_ * fVar5;
  auVar48._16_4_ = fVar5 * 0.0;
  auVar48._20_4_ = fVar5 * 0.0;
  auVar48._24_4_ = fVar5 * 0.0;
  auVar48._28_4_ = fVar5;
  auVar27 = vfmadd231ps_fma(auVar48,local_2c0,ZEXT1632(auVar25));
  auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),local_2e0,ZEXT1632(auVar24));
  auVar53._8_4_ = 0x3f800000;
  auVar53._0_8_ = 0x3f8000003f800000;
  auVar53._12_4_ = 0x3f800000;
  auVar53._16_4_ = 0x3f800000;
  auVar53._20_4_ = 0x3f800000;
  auVar53._24_4_ = 0x3f800000;
  auVar53._28_4_ = 0x3f800000;
  auVar51 = vcmpps_avx(ZEXT1632(auVar27),ZEXT432(0) << 0x20,4);
  auVar48 = vblendvps_avx(auVar53,ZEXT1632(auVar27),auVar51);
  auVar19._4_4_ = fVar70 * auVar21._4_4_;
  auVar19._0_4_ = fVar70 * auVar21._0_4_;
  auVar19._8_4_ = fVar70 * auVar21._8_4_;
  auVar19._12_4_ = fVar70 * auVar21._12_4_;
  auVar19._16_4_ = fVar70 * auVar21._16_4_;
  auVar19._20_4_ = fVar70 * auVar21._20_4_;
  auVar19._24_4_ = fVar70 * auVar21._24_4_;
  auVar19._28_4_ = auVar21._28_4_;
  auVar27 = vfmadd231ps_fma(auVar19,auVar66,auVar45);
  auVar45 = vunpcklps_avx(local_2a0,auVar71);
  auVar21._4_4_ = fVar70 * auVar45._4_4_;
  auVar21._0_4_ = fVar70 * auVar45._0_4_;
  auVar21._8_4_ = fVar70 * auVar45._8_4_;
  auVar21._12_4_ = fVar70 * auVar45._12_4_;
  auVar21._16_4_ = fVar70 * auVar45._16_4_;
  auVar21._20_4_ = fVar70 * auVar45._20_4_;
  auVar21._24_4_ = fVar70 * auVar45._24_4_;
  auVar21._28_4_ = local_2a0._28_4_;
  auVar45 = vunpcklps_avx(auVar18,auVar52);
  auVar28 = vfmadd231ps_fma(auVar21,auVar66,auVar45);
  fVar6 = *(float *)(ray + k * 4 + 0x40);
  auVar45._4_4_ = fVar6;
  auVar45._0_4_ = fVar6;
  auVar45._8_4_ = fVar6;
  auVar45._12_4_ = fVar6;
  auVar45._16_4_ = fVar6;
  auVar45._20_4_ = fVar6;
  auVar45._24_4_ = fVar6;
  auVar45._28_4_ = fVar6;
  auVar45 = vsubps_avx(ZEXT1632(auVar28),auVar45);
  auVar22._4_4_ = auVar26._4_4_ * auVar45._4_4_;
  auVar22._0_4_ = auVar26._0_4_ * auVar45._0_4_;
  auVar22._8_4_ = auVar26._8_4_ * auVar45._8_4_;
  auVar22._12_4_ = auVar26._12_4_ * auVar45._12_4_;
  auVar22._16_4_ = auVar45._16_4_ * 0.0;
  auVar22._20_4_ = auVar45._20_4_ * 0.0;
  auVar22._24_4_ = auVar45._24_4_ * 0.0;
  auVar22._28_4_ = auVar43._12_4_;
  fVar7 = *(float *)(ray + k * 4 + 0x20);
  auVar54._4_4_ = fVar7;
  auVar54._0_4_ = fVar7;
  auVar54._8_4_ = fVar7;
  auVar54._12_4_ = fVar7;
  auVar54._16_4_ = fVar7;
  auVar54._20_4_ = fVar7;
  auVar54._24_4_ = fVar7;
  auVar54._28_4_ = fVar7;
  auVar45 = vsubps_avx(ZEXT1632(auVar27),auVar54);
  auVar43 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar25),auVar45);
  fVar8 = *(float *)(ray + k * 4);
  auVar57._4_4_ = fVar8;
  auVar57._0_4_ = fVar8;
  auVar57._8_4_ = fVar8;
  auVar57._12_4_ = fVar8;
  auVar57._16_4_ = fVar8;
  auVar57._20_4_ = fVar8;
  auVar57._24_4_ = fVar8;
  auVar57._28_4_ = fVar8;
  auVar45 = vsubps_avx(ZEXT1632(auVar17),auVar57);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),ZEXT1632(auVar24),auVar45);
  local_200 = vdivps_avx(ZEXT1632(auVar43),auVar48);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar81._4_4_ = uVar9;
  auVar81._0_4_ = uVar9;
  auVar81._8_4_ = uVar9;
  auVar81._12_4_ = uVar9;
  auVar81._16_4_ = uVar9;
  auVar81._20_4_ = uVar9;
  auVar81._24_4_ = uVar9;
  auVar81._28_4_ = uVar9;
  auVar48 = vcmpps_avx(auVar81,local_200,2);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_280._4_4_ = uVar9;
  local_280._0_4_ = uVar9;
  local_280._8_4_ = uVar9;
  local_280._12_4_ = uVar9;
  local_280._16_4_ = uVar9;
  local_280._20_4_ = uVar9;
  local_280._24_4_ = uVar9;
  local_280._28_4_ = uVar9;
  auVar45 = vcmpps_avx(local_200,local_280,2);
  auVar48 = vandps_avx(auVar45,auVar48);
  auVar83._1_3_ = 0;
  auVar83[0] = bVar11;
  auVar83[4] = bVar11;
  auVar83._5_3_ = 0;
  auVar83[8] = bVar11;
  auVar83._9_3_ = 0;
  auVar83[0xc] = bVar11;
  auVar83._13_3_ = 0;
  auVar83[0x10] = bVar11;
  auVar83._17_3_ = 0;
  auVar83[0x14] = bVar11;
  auVar83._21_3_ = 0;
  auVar83[0x18] = bVar11;
  auVar83._25_3_ = 0;
  auVar83[0x1c] = bVar11;
  auVar83._29_3_ = 0;
  auVar45 = vpcmpgtd_avx2(auVar83,_DAT_01fe9900);
  auVar48 = vandps_avx(auVar48,auVar45);
  auVar45 = auVar51 & auVar48;
  if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar45 >> 0x7f,0) != '\0') ||
        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar45 >> 0xbf,0) != '\0') ||
      (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar45[0x1f] < '\0') {
    auVar45 = vunpckhps_avx(auVar18,auVar52);
    auVar18 = vunpckhps_avx(local_2a0,auVar71);
    auVar30._4_4_ = fVar70 * auVar18._4_4_;
    auVar30._0_4_ = fVar70 * auVar18._0_4_;
    auVar30._8_4_ = fVar70 * auVar18._8_4_;
    auVar30._12_4_ = fVar70 * auVar18._12_4_;
    auVar30._16_4_ = fVar70 * auVar18._16_4_;
    auVar30._20_4_ = fVar70 * auVar18._20_4_;
    auVar30._24_4_ = fVar70 * auVar18._24_4_;
    auVar30._28_4_ = fVar70;
    auVar29 = vfmadd231ps_fma(auVar30,auVar66,auVar45);
    auVar48 = vandps_avx(auVar48,auVar51);
    auVar43 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
    fVar70 = local_200._0_4_;
    fVar73 = local_200._4_4_;
    fVar74 = local_200._8_4_;
    fVar75 = local_200._12_4_;
    fVar76 = local_200._16_4_;
    fVar77 = local_200._20_4_;
    fVar78 = local_200._24_4_;
    auVar58._0_4_ = fVar70 * fVar3 + fVar8;
    auVar58._4_4_ = fVar73 * fVar3 + fVar8;
    auVar58._8_4_ = fVar74 * fVar3 + fVar8;
    auVar58._12_4_ = fVar75 * fVar3 + fVar8;
    auVar58._16_4_ = fVar76 * fVar3 + fVar8;
    auVar58._20_4_ = fVar77 * fVar3 + fVar8;
    auVar58._24_4_ = fVar78 * fVar3 + fVar8;
    auVar58._28_4_ = fVar8 + 0.0;
    auVar55._0_4_ = fVar70 * fVar4 + fVar7;
    auVar55._4_4_ = fVar73 * fVar4 + fVar7;
    auVar55._8_4_ = fVar74 * fVar4 + fVar7;
    auVar55._12_4_ = fVar75 * fVar4 + fVar7;
    auVar55._16_4_ = fVar76 * fVar4 + fVar7;
    auVar55._20_4_ = fVar77 * fVar4 + fVar7;
    auVar55._24_4_ = fVar78 * fVar4 + fVar7;
    auVar55._28_4_ = fVar7 + 0.0;
    auVar46._0_4_ = fVar70 * fVar5 + fVar6;
    auVar46._4_4_ = fVar73 * fVar5 + fVar6;
    auVar46._8_4_ = fVar74 * fVar5 + fVar6;
    auVar46._12_4_ = fVar75 * fVar5 + fVar6;
    auVar46._16_4_ = fVar76 * fVar5 + fVar6;
    auVar46._20_4_ = fVar77 * fVar5 + fVar6;
    auVar46._24_4_ = fVar78 * fVar5 + fVar6;
    auVar46._28_4_ = fVar6 + 0.0;
    auVar48 = vsubps_avx(auVar58,ZEXT1632(auVar17));
    auVar51 = vsubps_avx(auVar55,ZEXT1632(auVar27));
    auVar45 = vsubps_avx(auVar46,ZEXT1632(auVar28));
    auVar18._4_4_ = auVar45._4_4_ * auVar45._4_4_;
    auVar18._0_4_ = auVar45._0_4_ * auVar45._0_4_;
    auVar18._8_4_ = auVar45._8_4_ * auVar45._8_4_;
    auVar18._12_4_ = auVar45._12_4_ * auVar45._12_4_;
    auVar18._16_4_ = auVar45._16_4_ * auVar45._16_4_;
    auVar18._20_4_ = auVar45._20_4_ * auVar45._20_4_;
    auVar18._24_4_ = auVar45._24_4_ * auVar45._24_4_;
    auVar18._28_4_ = auVar45._28_4_;
    auVar17 = vfmadd231ps_fma(auVar18,auVar51,auVar51);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar48,auVar48);
    auVar31._28_4_ = auVar51._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(auVar29._12_4_ * auVar29._12_4_,
                            CONCAT48(auVar29._8_4_ * auVar29._8_4_,
                                     CONCAT44(auVar29._4_4_ * auVar29._4_4_,
                                              auVar29._0_4_ * auVar29._0_4_))));
    auVar48 = vcmpps_avx(ZEXT1632(auVar17),auVar31,1);
    auVar17 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
    auVar43 = vpand_avx(auVar17,auVar43);
    auVar48 = vpmovzxwd_avx2(auVar43);
    auVar48 = vpslld_avx2(auVar48,0x1f);
    if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar48 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar48 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar48 >> 0x7f,0) != '\0') ||
          (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar48 >> 0xbf,0) != '\0') ||
        (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar48[0x1f] < '\0')
    {
      auVar63 = ZEXT864(0) << 0x20;
      local_220 = ZEXT832(0) << 0x20;
      local_240 = ZEXT832(0) << 0x20;
      local_1e0 = ZEXT1632(auVar24);
      local_1c0 = ZEXT1632(auVar25);
      local_1a0 = ZEXT1632(auVar26);
      auVar43 = vpsllw_avx(auVar43,0xf);
      auVar43 = vpacksswb_avx(auVar43,auVar43);
      uVar41 = (ulong)(byte)(SUB161(auVar43 >> 7,0) & 1 | (SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar43 >> 0x37,0) & 1) << 6 | SUB161(auVar43 >> 0x3f,0) << 7);
      iVar33 = 1 << ((uint)k & 0x1f);
      auVar47._4_4_ = iVar33;
      auVar47._0_4_ = iVar33;
      auVar47._8_4_ = iVar33;
      auVar47._12_4_ = iVar33;
      auVar47._16_4_ = iVar33;
      auVar47._20_4_ = iVar33;
      auVar47._24_4_ = iVar33;
      auVar47._28_4_ = iVar33;
      auVar51 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar48 = vpand_avx2(auVar47,auVar51);
      auVar48 = vpcmpeqd_avx2(auVar48,auVar51);
      auVar67 = ZEXT3264(auVar48);
      auVar48 = vpcmpeqd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar29));
      auVar69 = ZEXT3264(auVar48);
      auVar72 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      do {
        local_310.hit = local_180;
        local_310.valid = (int *)local_340;
        uVar34 = 0;
        for (uVar32 = uVar41; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          uVar34 = uVar34 + 1;
        }
        local_c0 = local_260[uVar34];
        pGVar13 = (pSVar12->geometries).items[local_c0].ptr;
        if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          uVar32 = (ulong)(uint)((int)uVar34 * 4);
          local_120 = *(undefined4 *)(local_240 + uVar32);
          local_100 = *(undefined4 *)(local_220 + uVar32);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar32);
          local_310.context = context->user;
          uVar9 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar32);
          local_e0._4_4_ = uVar9;
          local_e0._0_4_ = uVar9;
          local_e0._8_4_ = uVar9;
          local_e0._12_4_ = uVar9;
          local_e0._16_4_ = uVar9;
          local_e0._20_4_ = uVar9;
          local_e0._24_4_ = uVar9;
          local_e0._28_4_ = uVar9;
          uVar9 = *(undefined4 *)(local_1e0 + uVar32);
          uVar10 = *(undefined4 *)(local_1c0 + uVar32);
          local_160._4_4_ = uVar10;
          local_160._0_4_ = uVar10;
          local_160._8_4_ = uVar10;
          local_160._12_4_ = uVar10;
          local_160._16_4_ = uVar10;
          local_160._20_4_ = uVar10;
          local_160._24_4_ = uVar10;
          local_160._28_4_ = uVar10;
          uVar10 = *(undefined4 *)(local_1a0 + uVar32);
          local_140._4_4_ = uVar10;
          local_140._0_4_ = uVar10;
          local_140._8_4_ = uVar10;
          local_140._12_4_ = uVar10;
          local_140._16_4_ = uVar10;
          local_140._20_4_ = uVar10;
          local_140._24_4_ = uVar10;
          local_140._28_4_ = uVar10;
          local_180[0] = (RTCHitN)(char)uVar9;
          local_180[1] = (RTCHitN)(char)((uint)uVar9 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar9;
          local_180[5] = (RTCHitN)(char)((uint)uVar9 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar9;
          local_180[9] = (RTCHitN)(char)((uint)uVar9 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar9;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar9 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar9;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar9 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar9;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar9 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar9;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar9 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar9;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar9 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_bc = local_c0;
          uStack_b8 = local_c0;
          uStack_b4 = local_c0;
          uStack_b0 = local_c0;
          uStack_ac = local_c0;
          uStack_a8 = local_c0;
          uStack_a4 = local_c0;
          uStack_9c = (local_310.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_310.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          auVar48 = auVar67._0_32_;
          local_310.geometryUserPtr = pGVar13->userPtr;
          local_310.N = 8;
          local_340 = auVar48;
          local_310.ray = (RTCRayN *)ray;
          if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar51 = ZEXT1632(auVar69._0_16_);
            (*pGVar13->occlusionFilterN)(&local_310);
            auVar72 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar51 = vpcmpeqd_avx2(auVar51,auVar51);
            auVar69 = ZEXT3264(auVar51);
            auVar67 = ZEXT3264(auVar48);
            auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar51 = vpcmpeqd_avx2(local_340,auVar63._0_32_);
          auVar48 = auVar69._0_32_ & ~auVar51;
          if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar48 >> 0x7f,0) == '\0') &&
                (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar48 >> 0xbf,0) == '\0') &&
              (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar48[0x1f]) {
            auVar51 = auVar69._0_32_ ^ auVar51;
          }
          else {
            p_Var16 = context->args->filter;
            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
              auVar48 = ZEXT1632(auVar69._0_16_);
              (*p_Var16)(&local_310);
              auVar72 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar48 = vpcmpeqd_avx2(auVar48,auVar48);
              auVar69 = ZEXT3264(auVar48);
              auVar67 = ZEXT3264(auVar67._0_32_);
              auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar48 = vpcmpeqd_avx2(local_340,auVar63._0_32_);
            auVar51 = auVar69._0_32_ ^ auVar48;
            auVar48 = vblendvps_avx(auVar72._0_32_,*(undefined1 (*) [32])(local_310.ray + 0x100),
                                    auVar48);
            *(undefined1 (*) [32])(local_310.ray + 0x100) = auVar48;
          }
          if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar51 >> 0x7f,0) != '\0') ||
                (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar51 >> 0xbf,0) != '\0') ||
              (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar51[0x1f] < '\0') {
            return true;
          }
          *(int *)(ray + k * 4 + 0x100) = local_280._0_4_;
        }
        uVar41 = uVar41 ^ 1L << (uVar34 & 0x3f);
      } while (uVar41 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }